

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Int FVar1;
  FT_GlyphSlot slot_00;
  FT_Driver pFVar2;
  FT_Module pFVar3;
  long lVar4;
  FT_Size pFVar5;
  FT_Face_Internal pFVar6;
  bool bVar7;
  FT_Error FVar8;
  char *pcVar9;
  FT_Long FVar10;
  FT_Renderer_conflict pFVar11;
  bool bVar12;
  FT_Render_Mode local_94;
  FT_Render_Mode mode_1;
  FT_Renderer_conflict renderer;
  FT_Face_Internal internal_1;
  FT_Size_Metrics *metrics;
  FT_Int transform_flags;
  FT_Face_Internal internal;
  FT_AutoHinter_Interface hinting;
  FT_Bool is_light_type1;
  FT_Render_Mode mode;
  TT_Face_conflict ttface;
  FT_Module hinter;
  FT_Bool autohint;
  FT_Library library;
  FT_GlyphSlot slot;
  FT_Driver driver;
  uint local_20;
  FT_Error error;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Face face_local;
  
  bVar7 = false;
  if (((face != (FT_Face)0x0) && (face->size != (FT_Size)0x0)) && (face->glyph != (FT_GlyphSlot)0x0)
     ) {
    slot_00 = face->glyph;
    ft_glyphslot_clear(slot_00);
    pFVar2 = face->driver;
    pFVar3 = ((pFVar2->root).library)->auto_hinter;
    if (((face->size->metrics).x_ppem == 0) ||
       (local_20 = load_flags, (face->size->metrics).y_ppem == 0)) {
      local_20 = load_flags | 1;
    }
    if ((local_20 & 0x400) != 0) {
      local_20 = local_20 | 0x801;
    }
    if ((local_20 & 1) != 0) {
      local_20 = local_20 & 0xfffffffb | 10;
    }
    if ((local_20 & 0x400000) != 0) {
      local_20 = local_20 & 0xfffffffb;
    }
    if ((((pFVar3 != (FT_Module)0x0) && ((local_20 & 2) == 0)) &&
        (((local_20 & 0x8000) == 0 &&
         (((face->face_flags & 1U) != 0 && ((face->face_flags & 0x2000U) == 0)))))) &&
       ((((local_20 & 0x800) != 0 ||
         (((face->internal->transform_matrix).yx == 0 &&
          ((face->internal->transform_matrix).xx != 0)))) ||
        (((face->internal->transform_matrix).xx == 0 && ((face->internal->transform_matrix).yx != 0)
         ))))) {
      if (((local_20 & 0x20) == 0) && ((((pFVar2->root).clazz)->module_flags & 0x400) != 0)) {
        pcVar9 = FT_Get_Font_Format(face);
        pcVar9 = strstr(pcVar9,"Type 1");
        bVar12 = false;
        if (pcVar9 != (char *)0x0) {
          bVar12 = *(int *)&pFVar2[1].root.clazz == 1;
        }
        if ((((((int)local_20 >> 0x10 & 0xf) == FT_RENDER_MODE_LIGHT) &&
             ((((pFVar2->root).clazz)->module_flags & 0x800) == 0)) && (!bVar12)) ||
           ((((face->face_flags & 8U) != 0 && (face[5].style_flags != 0)) &&
            ((*(short *)((long)&face[1].extensions + 6) == 0 &&
             ((face[4].bbox.xMax == 0 &&
              (lVar4._0_2_ = face[4].units_per_EM, lVar4._2_2_ = face[4].ascender,
              lVar4._4_2_ = face[4].descender, lVar4._6_2_ = face[4].height, lVar4 == 0)))))))) {
          bVar7 = true;
        }
      }
      else {
        bVar7 = true;
      }
    }
    if (bVar7) {
      if ((((face->face_flags & 0x10000U) == 0) ||
          (FVar8 = (*pFVar2->clazz->load_glyph)(slot_00,face->size,glyph_index,local_20 | 0x800000),
          FVar8 != 0)) || (slot_00->format != FT_GLYPH_FORMAT_SVG)) {
        if ((((face->face_flags & 2U) == 0) || ((local_20 & 8) != 0)) ||
           ((FVar8 = (*pFVar2->clazz->load_glyph)(slot_00,face->size,glyph_index,local_20 | 0x4000),
            FVar8 != 0 || (slot_00->format != FT_GLYPH_FORMAT_BITMAP)))) {
          pFVar6 = face->internal;
          FVar1 = pFVar6->transform_flags;
          pFVar6->transform_flags = 0;
          driver._4_4_ = (**(code **)((long)pFVar3->clazz->module_interface + 0x18))
                                   (pFVar3,slot_00,face->size,glyph_index,local_20);
          pFVar6->transform_flags = FVar1;
        }
        else {
          driver._4_4_ = 0;
        }
      }
      else {
        driver._4_4_ = 0;
      }
    }
    else {
      FVar8 = (*pFVar2->clazz->load_glyph)(slot_00,face->size,glyph_index,local_20);
      if (FVar8 != 0) {
        return FVar8;
      }
      driver._4_4_ = 0;
      if (slot_00->format == FT_GLYPH_FORMAT_OUTLINE) {
        FVar8 = FT_Outline_Check(&slot_00->outline);
        if (FVar8 != 0) {
          return FVar8;
        }
        driver._4_4_ = 0;
        if ((local_20 & 2) == 0) {
          ft_glyphslot_grid_fit_metrics(slot_00,(local_20 & 0x10) != 0);
        }
      }
    }
    if ((local_20 & 0x10) == 0) {
      (slot_00->advance).x = (slot_00->metrics).horiAdvance;
      (slot_00->advance).y = 0;
    }
    else {
      (slot_00->advance).x = 0;
      (slot_00->advance).y = (slot_00->metrics).vertAdvance;
    }
    if (((local_20 & 0x2000) == 0) && ((face->face_flags & 1U) != 0)) {
      pFVar5 = face->size;
      FVar10 = FT_MulDiv(slot_00->linearHoriAdvance,(pFVar5->metrics).x_scale,0x40);
      slot_00->linearHoriAdvance = FVar10;
      FVar10 = FT_MulDiv(slot_00->linearVertAdvance,(pFVar5->metrics).y_scale,0x40);
      slot_00->linearVertAdvance = FVar10;
    }
    if (((local_20 & 0x800) == 0) && (pFVar6 = face->internal, pFVar6->transform_flags != 0)) {
      pFVar11 = ft_lookup_glyph_renderer(slot_00);
      if (pFVar11 == (FT_Renderer_conflict)0x0) {
        if (slot_00->format == FT_GLYPH_FORMAT_OUTLINE) {
          if ((pFVar6->transform_flags & 1U) != 0) {
            FT_Outline_Transform(&slot_00->outline,&pFVar6->transform_matrix);
          }
          if ((pFVar6->transform_flags & 2U) != 0) {
            FT_Outline_Translate
                      (&slot_00->outline,(pFVar6->transform_delta).x,(pFVar6->transform_delta).y);
          }
        }
      }
      else {
        driver._4_4_ = (*pFVar11->clazz->transform_glyph)
                                 (pFVar11,slot_00,&pFVar6->transform_matrix,&pFVar6->transform_delta
                                 );
      }
      FT_Vector_Transform(&slot_00->advance,&pFVar6->transform_matrix);
    }
    slot_00->glyph_index = glyph_index;
    slot_00->internal->load_flags = local_20;
    if ((((driver._4_4_ == 0) && ((local_20 & 1) == 0)) &&
        (slot_00->format != FT_GLYPH_FORMAT_BITMAP)) &&
       (slot_00->format != FT_GLYPH_FORMAT_COMPOSITE)) {
      local_94 = (int)local_20 >> 0x10 & 0xf;
      if ((local_94 == FT_RENDER_MODE_NORMAL) && ((local_20 & 0x1000) != 0)) {
        local_94 = FT_RENDER_MODE_MONO;
      }
      if ((local_20 & 4) == 0) {
        ft_glyphslot_preset_bitmap(slot_00,local_94,(FT_Vector *)0x0);
      }
      else {
        driver._4_4_ = FT_Render_Glyph(slot_00,local_94);
      }
    }
    return driver._4_4_;
  }
  return 0x23;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* undefined scale means no scale */
    if ( face->size->metrics.x_ppem == 0 ||
         face->size->metrics.y_ppem == 0 )
      load_flags |= FT_LOAD_NO_SCALE;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_IS_SCALABLE( face )                           &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* XXX: The use of the `FT_LOAD_XXX_ONLY` flags is not very */
      /*      elegant.                                            */

      /* try to load SVG documents if available */
      if ( FT_HAS_SVG( face ) )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SVG_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_SVG )
          goto Load_Ok;
      }

      /* try to load embedded bitmaps if available */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics(
            slot,
            FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    slot->glyph_index          = glyph_index;
    slot->internal->load_flags = load_flags;

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Load_Glyph: index %d, flags 0x%x\n",
                glyph_index, load_flags ));
    FT_TRACE5(( "  bitmap %dx%d %s, %s (mode %d)\n",
                slot->bitmap.width,
                slot->bitmap.rows,
                slot->outline.points ?
                  slot->bitmap.buffer ? "rendered"
                                      : "preset"
                                     :
                  slot->internal->flags & FT_GLYPH_OWN_BITMAP ? "owned"
                                                              : "unowned",
                pixel_modes[slot->bitmap.pixel_mode],
                slot->bitmap.pixel_mode ));
    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "  x advance: %f\n", (double)slot->advance.x / 64 ));
    FT_TRACE5(( "  y advance: %f\n", (double)slot->advance.y / 64 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                (double)slot->linearHoriAdvance / 65536 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                (double)slot->linearVertAdvance / 65536 ));

    {
      FT_Glyph_Metrics*  metrics = &slot->metrics;


      FT_TRACE5(( "  metrics:\n" ));
      FT_TRACE5(( "    width:  %f\n", (double)metrics->width / 64 ));
      FT_TRACE5(( "    height: %f\n", (double)metrics->height / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    horiBearingX: %f\n",
                  (double)metrics->horiBearingX / 64 ));
      FT_TRACE5(( "    horiBearingY: %f\n",
                  (double)metrics->horiBearingY / 64 ));
      FT_TRACE5(( "    horiAdvance:  %f\n",
                  (double)metrics->horiAdvance / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    vertBearingX: %f\n",
                  (double)metrics->vertBearingX / 64 ));
      FT_TRACE5(( "    vertBearingY: %f\n",
                  (double)metrics->vertBearingY / 64 ));
      FT_TRACE5(( "    vertAdvance:  %f\n",
                  (double)metrics->vertAdvance / 64 ));
    }
#endif

  Exit:
    return error;
  }